

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O3

size_t __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::NeededBytesWithExtraSource(SDES *this)

{
  long lVar1;
  _Self __tmp;
  _List_node_base *p_Var2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  p_Var2 = (this->sdessources).
           super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->sdessources) {
    lVar5 = 0;
    do {
      lVar4 = (long)p_Var2[1]._M_next[3]._M_next;
      lVar1 = lVar4 + 1;
      uVar3 = (ulong)((uint)lVar1 & 3);
      lVar4 = (lVar4 - uVar3) + 5;
      if (uVar3 == 0) {
        lVar4 = lVar1;
      }
      p_Var2 = p_Var2->_M_next;
      lVar5 = lVar5 + lVar4 + 4;
    } while (p_Var2 != (_List_node_base *)&this->sdessources);
    uVar3 = (this->sdessources).
            super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
            ._M_impl._M_node._M_size + 1;
    return lVar5 + ((ulong)(0x842108421084210 < uVar3 * -0x1084210842108421) + uVar3 / 0x1f) * 4 + 8
    ;
  }
  return 0;
}

Assistant:

size_t NeededBytesWithExtraSource()
		{
			std::list<SDESSource *>::const_iterator it;
			size_t x = 0;
			size_t n,d,r;
			
			if (sdessources.empty())
				return 0;
			
			for (it = sdessources.begin() ; it != sdessources.end() ; it++)
				x += (*it)->NeededBytes();
			
			// for the extra source we'll need at least 8 bytes (ssrc and four 0 bytes)
			x += sizeof(uint32_t)*2;
			
			n = sdessources.size() + 1; // also, the number of sources will increase
			d = n/31;
			r = n%31;
			if (r != 0)
				d++;
			x += d*sizeof(RTCPCommonHeader);
			return x;
		}